

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.c
# Opt level: O2

void BrotliBuildHistogramsWithContext
               (Command_conflict *cmds,size_t num_commands,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split,uint8_t *ringbuffer,
               size_t start_pos,size_t mask,uint8_t prev_byte,uint8_t prev_byte2,
               ContextType *context_modes,HistogramLiteral *literal_histograms,
               HistogramCommand *insert_and_copy_histograms,HistogramDistance *copy_dist_histograms)

{
  ushort uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  uint uVar8;
  bool bVar9;
  BlockSplitIterator dist_it;
  BlockSplitIterator insert_and_copy_it;
  BlockSplitIterator literal_it;
  
  literal_it.idx_ = 0;
  literal_it.type_ = 0;
  if (literal_split->lengths == (uint *)0x0) {
    literal_it.length_ = 0;
  }
  else {
    literal_it.length_ = (size_t)*literal_split->lengths;
  }
  insert_and_copy_it.idx_ = 0;
  insert_and_copy_it.type_ = 0;
  if (insert_and_copy_split->lengths == (uint *)0x0) {
    insert_and_copy_it.length_ = 0;
  }
  else {
    insert_and_copy_it.length_ = (size_t)*insert_and_copy_split->lengths;
  }
  dist_it.idx_ = 0;
  dist_it.type_ = 0;
  if (dist_split->lengths == (uint *)0x0) {
    dist_it.length_ = 0;
  }
  else {
    dist_it.length_ = (size_t)*dist_split->lengths;
  }
  dist_it.split_ = dist_split;
  insert_and_copy_it.split_ = insert_and_copy_split;
  literal_it.split_ = literal_split;
  for (sVar7 = 0; sVar7 != num_commands; sVar7 = sVar7 + 1) {
    BlockSplitIteratorNext(&insert_and_copy_it);
    uVar1 = cmds[sVar7].cmd_prefix_;
    insert_and_copy_histograms[insert_and_copy_it.type_].data_[uVar1] =
         insert_and_copy_histograms[insert_and_copy_it.type_].data_[uVar1] + 1;
    insert_and_copy_histograms[insert_and_copy_it.type_].total_count_ =
         insert_and_copy_histograms[insert_and_copy_it.type_].total_count_ + 1;
    uVar5 = (ulong)cmds[sVar7].insert_len_;
    lVar6 = -start_pos;
    while (bVar9 = uVar5 != 0, uVar5 = uVar5 - 1, bVar9) {
      BlockSplitIteratorNext(&literal_it);
      sVar2 = literal_it.type_;
      if (context_modes != (ContextType *)0x0) {
        sVar2 = literal_it.type_ * 0x40 +
                (ulong)(""[(ulong)prev_byte2 + 0x100 + (ulong)(context_modes[literal_it.type_] << 9)
                          ] | ""[(ulong)prev_byte + (ulong)(context_modes[literal_it.type_] << 9)]);
      }
      uVar4 = start_pos & mask;
      literal_histograms[sVar2].data_[ringbuffer[uVar4]] =
           literal_histograms[sVar2].data_[ringbuffer[uVar4]] + 1;
      literal_histograms[sVar2].total_count_ = literal_histograms[sVar2].total_count_ + 1;
      start_pos = start_pos + 1;
      lVar6 = lVar6 + -1;
      prev_byte2 = prev_byte;
      prev_byte = ringbuffer[uVar4];
    }
    uVar8 = cmds[sVar7].copy_len_ & 0x1ffffff;
    if (uVar8 != 0) {
      lVar3 = (ulong)uVar8 - lVar6;
      prev_byte2 = ringbuffer[lVar3 - 2U & mask];
      prev_byte = ringbuffer[lVar3 - 1U & mask];
      if (0x7f < uVar1) {
        BlockSplitIteratorNext(&dist_it);
        uVar5 = (ulong)(uVar1 & 7);
        if (2 < (uVar1 & 7)) {
          uVar5 = 3;
        }
        uVar4 = 3;
        if (((uVar1 >> 6) - 2 & 0xfffffffd) == 0) {
          uVar4 = uVar5;
        }
        if (uVar1 >> 6 == 7) {
          uVar4 = uVar5;
        }
        lVar3 = uVar4 + dist_it.type_ * 4;
        copy_dist_histograms[lVar3].data_[cmds[sVar7].dist_prefix_ & 0x3ff] =
             copy_dist_histograms[lVar3].data_[cmds[sVar7].dist_prefix_ & 0x3ff] + 1;
        copy_dist_histograms[lVar3].total_count_ = copy_dist_histograms[lVar3].total_count_ + 1;
      }
    }
    start_pos = (ulong)uVar8 - lVar6;
  }
  return;
}

Assistant:

void BrotliBuildHistogramsWithContext(
    const Command* cmds, const size_t num_commands,
    const BlockSplit* literal_split, const BlockSplit* insert_and_copy_split,
    const BlockSplit* dist_split, const uint8_t* ringbuffer, size_t start_pos,
    size_t mask, uint8_t prev_byte, uint8_t prev_byte2,
    const ContextType* context_modes, HistogramLiteral* literal_histograms,
    HistogramCommand* insert_and_copy_histograms,
    HistogramDistance* copy_dist_histograms) {
  size_t pos = start_pos;
  BlockSplitIterator literal_it;
  BlockSplitIterator insert_and_copy_it;
  BlockSplitIterator dist_it;
  size_t i;

  InitBlockSplitIterator(&literal_it, literal_split);
  InitBlockSplitIterator(&insert_and_copy_it, insert_and_copy_split);
  InitBlockSplitIterator(&dist_it, dist_split);
  for (i = 0; i < num_commands; ++i) {
    const Command* cmd = &cmds[i];
    size_t j;
    BlockSplitIteratorNext(&insert_and_copy_it);
    HistogramAddCommand(&insert_and_copy_histograms[insert_and_copy_it.type_],
        cmd->cmd_prefix_);
    /* TODO: unwrap iterator blocks. */
    for (j = cmd->insert_len_; j != 0; --j) {
      size_t context;
      BlockSplitIteratorNext(&literal_it);
      context = literal_it.type_;
      if (context_modes) {
        ContextLut lut = BROTLI_CONTEXT_LUT(context_modes[context]);
        context = (context << BROTLI_LITERAL_CONTEXT_BITS) +
            BROTLI_CONTEXT(prev_byte, prev_byte2, lut);
      }
      HistogramAddLiteral(&literal_histograms[context],
          ringbuffer[pos & mask]);
      prev_byte2 = prev_byte;
      prev_byte = ringbuffer[pos & mask];
      ++pos;
    }
    pos += CommandCopyLen(cmd);
    if (CommandCopyLen(cmd)) {
      prev_byte2 = ringbuffer[(pos - 2) & mask];
      prev_byte = ringbuffer[(pos - 1) & mask];
      if (cmd->cmd_prefix_ >= 128) {
        size_t context;
        BlockSplitIteratorNext(&dist_it);
        context = (dist_it.type_ << BROTLI_DISTANCE_CONTEXT_BITS) +
            CommandDistanceContext(cmd);
        HistogramAddDistance(&copy_dist_histograms[context],
            cmd->dist_prefix_ & 0x3FF);
      }
    }
  }
}